

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:766:13)>
::getImpl(SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:766:13)>
          *this,ExceptionOrValue *output)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
  aVar1;
  ReadResult result;
  ExceptionOr<kj::AsyncCapabilityStream::ReadResult> depResult;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
  local_388;
  ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> local_380;
  ExceptionOrValue local_1d8;
  char local_40;
  size_t local_38;
  
  local_1d8.exception.ptr.isSet = false;
  local_40 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_1d8);
  if (local_1d8.exception.ptr.isSet == true) {
    local_380.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_380.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_1d8.exception.ptr.field_1.value.ownFile.content.ptr;
    local_380.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_1d8.exception.ptr.field_1.value.ownFile.content.size_;
    local_380.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_1d8.exception.ptr.field_1.value.ownFile.content.disposer;
    local_1d8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_1d8.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_380.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_1d8.exception.ptr.field_1.value.file;
    local_380.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_1d8.exception.ptr.field_1._32_8_;
    local_380.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_1d8.exception.ptr.field_1.value.description.content.ptr;
    local_380.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_1d8.exception.ptr.field_1.value.description.content.size_;
    local_380.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_1d8.exception.ptr.field_1.value.description.content.disposer;
    local_1d8.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_1d8.exception.ptr.field_1.value.description.content.size_ = 0;
    local_380.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_1d8.exception.ptr.field_1.value.context.ptr.disposer;
    local_380.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         local_1d8.exception.ptr.field_1.value.context.ptr.ptr;
    local_1d8.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_380.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_1d8.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_380.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_1d8.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_380.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_1d8.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_1d8.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_1d8.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_380.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_1d8.exception.ptr.field_1 + 0x68),0x105);
    local_380.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_1d8.exception.ptr.field_1.value.details.builder.ptr;
    local_380.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_1d8.exception.ptr.field_1.value.details.builder.pos;
    local_380.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_1d8.exception.ptr.field_1.value.details.builder.endPtr;
    local_380.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_1d8.exception.ptr.field_1.value.details.builder.disposer;
    local_1d8.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_1d8.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1d8.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_380.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> *)output,
               &local_380);
    aVar1 = local_380.value.ptr.field_1;
    if ((local_380.value.ptr.isSet == true) &&
       (local_380.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
         )0x0)) {
      local_380.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
            )0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar1);
    }
  }
  else {
    if (local_40 != '\x01') goto LAB_00309924;
    result.capCount = local_38;
    result.byteCount = (size_t)&this->func;
    anon_class_72_6_61548c34_for_func::operator()
              ((anon_class_72_6_61548c34_for_func *)&local_388.value,result);
    local_380.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_380.value.ptr.isSet = true;
    local_380.value.ptr.field_1 = local_388;
    local_388 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
                 )0x0;
    ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> *)output,
               &local_380);
    aVar1 = local_380.value.ptr.field_1;
    if ((local_380.value.ptr.isSet == true) &&
       (local_380.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
         )0x0)) {
      local_380.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
            )0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar1);
    }
  }
  if (local_380.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_380.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_00309924:
  if (local_1d8.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1d8.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }